

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::LoopDependenceAnalysis::SymbolicStrongSIVTest
          (LoopDependenceAnalysis *this,SENode *source,SENode *destination,SENode *coefficient,
          DistanceEntry *distance_entry)

{
  bool bVar1;
  Directions DVar2;
  SENode *pSVar3;
  Loop *loop;
  allocator<char> local_a9;
  DistanceEntry *local_a8;
  pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> subscript_pair;
  string local_90;
  string local_70;
  string local_50;
  
  local_a8 = distance_entry;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Performing SymbolicStrongSIVTest.",
             (allocator<char> *)&subscript_pair);
  PrintDebug(this,&local_50);
  std::__cxx11::string::_M_dispose();
  pSVar3 = ScalarEvolutionAnalysis::CreateSubtraction(&this->scalar_evolution_,source,destination);
  pSVar3 = ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,pSVar3);
  subscript_pair.first = source;
  subscript_pair.second = destination;
  loop = GetLoopForSubscriptPair(this,&subscript_pair);
  bVar1 = IsProvablyOutsideOfLoopBounds(this,loop,pSVar3,coefficient);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"SymbolicStrongSIVTest proved independence through loop bounds.",
               &local_a9);
    PrintDebug(this,&local_70);
    std::__cxx11::string::_M_dispose();
    local_a8->dependence_information = DIRECTION;
    DVar2 = NONE;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,
               "SymbolicStrongSIVTest was unable to determine any dependence information.",&local_a9
              );
    PrintDebug(this,&local_90);
    std::__cxx11::string::_M_dispose();
    DVar2 = ALL;
  }
  local_a8->direction = DVar2;
  return bVar1;
}

Assistant:

bool LoopDependenceAnalysis::SymbolicStrongSIVTest(
    SENode* source, SENode* destination, SENode* coefficient,
    DistanceEntry* distance_entry) {
  PrintDebug("Performing SymbolicStrongSIVTest.");
  SENode* source_destination_delta = scalar_evolution_.SimplifyExpression(
      scalar_evolution_.CreateSubtraction(source, destination));
  // By cancelling out the induction variables by subtracting the source and
  // destination we can produce an expression of symbolics and constants. This
  // expression can be compared to the loop bounds to find if the offset is
  // outwith the bounds.
  std::pair<SENode*, SENode*> subscript_pair =
      std::make_pair(source, destination);
  const Loop* subscript_loop = GetLoopForSubscriptPair(subscript_pair);
  if (IsProvablyOutsideOfLoopBounds(subscript_loop, source_destination_delta,
                                    coefficient)) {
    PrintDebug(
        "SymbolicStrongSIVTest proved independence through loop bounds.");
    distance_entry->dependence_information =
        DistanceEntry::DependenceInformation::DIRECTION;
    distance_entry->direction = DistanceEntry::Directions::NONE;
    return true;
  }
  // We were unable to prove independence or discern any additional information.
  // Must assume <=> direction.
  PrintDebug(
      "SymbolicStrongSIVTest was unable to determine any dependence "
      "information.");
  distance_entry->direction = DistanceEntry::Directions::ALL;
  return false;
}